

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexTools.cpp
# Opt level: O0

LIndex * IndexTools::CalculateStepSize
                   (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *nrElems)

{
  undefined1 auVar1 [16];
  size_type sVar2;
  ulong uVar3;
  LIndex *pLVar4;
  const_reference pvVar5;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *in_RDI;
  Index i;
  LIndex *step_size;
  size_t vec_size;
  uint local_1c;
  
  sVar2 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::size(in_RDI);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pLVar4 = (LIndex *)operator_new__(uVar3);
  pLVar4[sVar2 - 1] = 1;
  if (sVar2 != 1) {
    for (local_1c = (int)sVar2 - 2; local_1c != 0; local_1c = local_1c - 1) {
      pvVar5 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                         (in_RDI,(ulong)(local_1c + 1));
      pLVar4[local_1c] = *pvVar5 * pLVar4[local_1c + 1];
    }
    pvVar5 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       (in_RDI,1);
    *pLVar4 = *pvVar5 * pLVar4[1];
  }
  return pLVar4;
}

Assistant:

LIndex * IndexTools::CalculateStepSize(const vector<LIndex>& nrElems)
{
    size_t vec_size = nrElems.size();
    //increment indicates for each agent how many the joint index is
    //incremented to get the next individual action...
    LIndex * step_size = new LIndex[vec_size];
    //the step_size for the last agent is 1
    step_size[vec_size-1] = 1;
    if(vec_size != 1)
    {
        Index i = vec_size-2;
        while(1)
        {
            if(i>0)
            {
                step_size[i] = nrElems[i+1] * step_size[i+1];
                i--;
            }
            else if(i==0)
            {
                step_size[i] = nrElems[i+1] * step_size[i+1];
                break;
            }
        }
    }
    return(step_size);
}